

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Action::~Action(Action *this)

{
  this->_vptr_Action = (_func_int **)&PTR__Action_001942d8;
  std::__cxx11::string::_M_dispose();
  Var::~Var(&this->module_var);
  return;
}

Assistant:

virtual ~Action() = default;